

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRFakeTrackerDevice.cpp
# Opt level: O2

void __thiscall MinVR::VRFakeTrackerDevice::onVREvent(VRFakeTrackerDevice *this)

{
  VRDataIndex *in_RSI;
  
  onVREvent((VRFakeTrackerDevice *)
            &this[-1]._pendingEvents._dataMap._M_t._M_impl.super__Rb_tree_header._M_node_count,
            in_RSI);
  return;
}

Assistant:

void VRFakeTrackerDevice::onVREvent(const VRDataIndex &eventData)
{
  if (eventData.getName() == _toggleEvent) {
    _tracking = !_tracking;
    if (_tracking) {
      if (_sticky) {
        _state = VRFakeTrackerDevice::XYTranslating;
      } else {
        _state = VRFakeTrackerDevice::None;
      }
    }
  }
  else if (eventData.getName() == _translateZOnEvent) {
    if (_state !=  VRFakeTrackerDevice::ZTranslating) {
      _state = VRFakeTrackerDevice::ZTranslating;
    } else {
      _state = VRFakeTrackerDevice::None;
    }
  }
  else if (eventData.getName() == _translateOnEvent) {
    if (_state != VRFakeTrackerDevice::XYTranslating) {
      _state = VRFakeTrackerDevice::XYTranslating;
    } else {
      _state = VRFakeTrackerDevice::None;
    }
  }
  else if (eventData.getName() == _rotateOnEvent) {
    if (_state != VRFakeTrackerDevice::Rotating) {
      _state = VRFakeTrackerDevice::Rotating;
    } else {
      _state = VRFakeTrackerDevice::None;
    }
  }
  else if (eventData.getName() == _rollOnEvent) {
    if (_state != VRFakeTrackerDevice::Rolling) {
      _state = VRFakeTrackerDevice::Rolling;
    } else {
      _state = VRFakeTrackerDevice::None;
    }
  }
  else if (eventData.getName() == _translateZOffEvent && !_sticky) {
    _state = VRFakeTrackerDevice::None;
  }
  else if (eventData.getName() == _translateOffEvent && !_sticky) {
    _state = VRFakeTrackerDevice::None;
  }
  else if (eventData.getName() == _rotateOffEvent && !_sticky) {
    _state = VRFakeTrackerDevice::None;
  }
  else if (eventData.getName() == _rollOffEvent && !_sticky) {
    _state = VRFakeTrackerDevice::None;
  }
  else if (eventData.getName() == "Mouse_Move") {
    const VRFloatArray screenPos = eventData.getValue("NormalizedPosition");
    if (!screenPos.empty()) {

      // Transform range from [0,1] to [-1,1].
      float mousex = 2.0f * (screenPos[0] - 0.5f);
      float mousey = 2.0f * ((1.0f - screenPos[1]) - 0.5f);

      // If we're not currently tracking, ignore the mouse.
      if (_tracking) {
        float deltaX = mousex - _lastMouseX;
        float deltaY = mousey - _lastMouseY;

        if (_state == VRFakeTrackerDevice::ZTranslating) {
          // If we're Z translating, that's up and down in the seeker mode, but
          // forward and backward in the looker mode.
          if (_seeker) {
            _statePos =  VRVector3(0, _zScale * deltaY, 0) + _statePos;
          } else {
            _statePos =  VRVector3(0, 0, _zScale * deltaY) + _statePos;
          }
        }
        else if (_state == VRFakeTrackerDevice::Rotating) {
          // The seeker mode turns the viewer around in place, while the looker
          // mode rotates the object in front of the viewer.  More or less.

          VRMatrix4 r;

          if (_seeker) {
            VRVector3 up = _stateRot * VRVector3(0.0f, 1.0f, 0.0f);
            // Not sure why these coordinates have to be negated.
            VRPoint3 here = VRPoint3(-_statePos[0], -_statePos[1], -_statePos[2]);
            VRVector3 over = up.cross(_statePos);

            r = VRMatrix4::rotation(here, up, _rScale * deltaX) *
              VRMatrix4::rotation(here, over, _rScale * deltaY);

          } else {
            r = VRMatrix4::rotationY(_rScale * deltaX) *
              VRMatrix4::rotationX(-_rScale * deltaY);
          }
          _stateRot = r * _stateRot;
        }
        else if (_state == VRFakeTrackerDevice::Rolling) {
          VRMatrix4 r = VRMatrix4::rotationZ(_rScale * deltaX);
          _stateRot = r * _stateRot;
        }
        else if (_state == VRFakeTrackerDevice::XYTranslating){
          // The seeker mode moves us in the horizontal plane, while the looker
          // mode moves us in a vertical plane.
          if (_seeker) {
            _statePos =  _xyScale * VRVector3(deltaX, 0, deltaY) + _statePos;
          } else {
            _statePos =  _xyScale * VRVector3(deltaX, deltaY, 0) + _statePos;
          }
        }

        _transform = VRMatrix4::translation(_statePos) * _stateRot;

        VRDataIndex di = VRTrackerEvent::createValidDataIndex(_eventName, _transform.toVRFloatArray());
        _pendingEvents.push(di);
      }

      _lastMouseX = mousex;
      _lastMouseY = mousey;
    }
  }
}